

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::CallContextHooks(ImGuiContext *ctx,ImGuiContextHookType hook_type)

{
  ImVector<ImGuiContextHook> *this;
  code *pcVar1;
  ImGuiContextHook *pIVar2;
  int n;
  int i;
  
  this = &ctx->Hooks;
  for (i = 0; i < this->Size; i = i + 1) {
    pIVar2 = ImVector<ImGuiContextHook>::operator[](this,i);
    if (*(ImGuiContextHookType *)(pIVar2 + 4) == hook_type) {
      pIVar2 = ImVector<ImGuiContextHook>::operator[](this,i);
      pcVar1 = *(code **)(pIVar2 + 0x10);
      pIVar2 = ImVector<ImGuiContextHook>::operator[](this,i);
      (*pcVar1)(ctx,pIVar2);
    }
  }
  return;
}

Assistant:

void ImGui::CallContextHooks(ImGuiContext* ctx, ImGuiContextHookType hook_type)
{
    ImGuiContext& g = *ctx;
    for (int n = 0; n < g.Hooks.Size; n++)
        if (g.Hooks[n].Type == hook_type)
            g.Hooks[n].Callback(&g, &g.Hooks[n]);
}